

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void (anonymous_namespace)::
     time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
               (_func_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                *f,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,int n,
               string *label)

{
  ostream *poVar1;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> res;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_50;
  
  std::chrono::_V2::system_clock::now();
  if (0 < n) {
    do {
      (*f)(&local_50,arg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 2 + 2);
      }
      n = n + -1;
    } while (n != 0);
  }
  std::chrono::_V2::system_clock::now();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(label->_M_dataplus)._M_p,label->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," took ",6);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ms\n",3);
  return;
}

Assistant:

void time_function_call(Func f, const Arg& arg, int n, const string& label)
{
    timer t;
    for (int i = 0; i < n; i++) {
        volatile auto res = f(arg);
    }
    auto e = t.elapsed();
    std::cout << label << " took " << e.count() << "ms\n";
}